

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSolutionDebug.cpp
# Opt level: O3

HighsDebugStatus
debugCompareHighsInfoStatus(HighsOptions *options,HighsInfo *highs_info0,HighsInfo *highs_info1)

{
  HighsDebugStatus HVar1;
  uint uVar2;
  HighsDebugStatus status0;
  undefined1 *local_68 [2];
  undefined1 local_58 [16];
  undefined1 *local_48 [2];
  undefined1 local_38 [16];
  
  local_48[0] = local_38;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_48,"primal_status","");
  HVar1 = kOk;
  uVar2 = (highs_info1->super_HighsInfoStruct).primal_solution_status -
          (highs_info0->super_HighsInfoStruct).primal_solution_status;
  if (uVar2 != 0) {
    HVar1 = kLogicalError;
    highsLogDev(&(options->super_HighsOptionsStruct).log_options,kError,
                "SolutionPar:  difference of %d for %s\n",(ulong)uVar2,local_48[0]);
  }
  HVar1 = debugWorseStatus(HVar1,kOk);
  if (local_48[0] != local_38) {
    operator_delete(local_48[0]);
  }
  local_68[0] = local_58;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_68,"dual_status","");
  status0 = kOk;
  uVar2 = (highs_info1->super_HighsInfoStruct).dual_solution_status -
          (highs_info0->super_HighsInfoStruct).dual_solution_status;
  if (uVar2 != 0) {
    status0 = kLogicalError;
    highsLogDev(&(options->super_HighsOptionsStruct).log_options,kError,
                "SolutionPar:  difference of %d for %s\n",(ulong)uVar2,local_68[0]);
  }
  HVar1 = debugWorseStatus(status0,HVar1);
  if (local_68[0] != local_58) {
    operator_delete(local_68[0]);
  }
  return HVar1;
}

Assistant:

HighsDebugStatus debugCompareHighsInfoStatus(const HighsOptions& options,
                                             const HighsInfo& highs_info0,
                                             const HighsInfo& highs_info1) {
  HighsDebugStatus return_status = HighsDebugStatus::kOk;
  return_status = debugWorseStatus(
      debugCompareHighsInfoInteger("primal_status", options,
                                   highs_info0.primal_solution_status,
                                   highs_info1.primal_solution_status),
      return_status);
  return_status = debugWorseStatus(
      debugCompareHighsInfoInteger("dual_status", options,
                                   highs_info0.dual_solution_status,
                                   highs_info1.dual_solution_status),
      return_status);
  return return_status;
}